

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O0

stbi_uc * stbi__pic_load_core(stbi__context *s,int width,int height,int *comp,stbi_uc *result)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi_uc *psVar4;
  int iVar5;
  long lVar6;
  stbi_uc local_ac [4];
  int local_a8;
  stbi_uc value_1 [4];
  int i_1;
  int count_1;
  int left_1;
  undefined1 auStack_94 [3];
  stbi_uc value [4];
  stbi_uc count;
  int i;
  int left;
  int x;
  stbi_uc *dest;
  stbi__pic_packet *packet_1;
  int packet_idx;
  stbi__pic_packet *packet;
  stbi__pic_packet packets [10];
  int local_3c;
  int chained;
  int y;
  int num_packets;
  int act_comp;
  stbi_uc *result_local;
  int *comp_local;
  int height_local;
  int width_local;
  stbi__context *s_local;
  
  y = 0;
  chained = 0;
  do {
    if (chained == 10) {
      stbi__err("bad format");
      return (stbi_uc *)0x0;
    }
    iVar5 = chained + 1;
    lVar6 = (long)chained;
    sVar1 = stbi__get8(s);
    sVar2 = stbi__get8(s);
    packets[lVar6 + -3].type = sVar2;
    sVar2 = stbi__get8(s);
    packets[lVar6 + -3].channel = sVar2;
    sVar2 = stbi__get8(s);
    packets[lVar6 + -2].size = sVar2;
    y = (uint)packets[lVar6 + -2].size | y;
    iVar3 = stbi__at_eof(s);
    if (iVar3 != 0) {
      stbi__err("bad file");
      return (stbi_uc *)0x0;
    }
    if (packets[lVar6 + -3].type != '\b') {
      stbi__err("bad format");
      return (stbi_uc *)0x0;
    }
    chained = iVar5;
  } while (sVar1 != '\0');
  iVar3 = 3;
  if ((y & 0x10U) != 0) {
    iVar3 = 4;
  }
  *comp = iVar3;
  local_3c = 0;
  do {
    if (height <= local_3c) {
      return result;
    }
    for (packet_1._4_4_ = 0; packet_1._4_4_ < iVar5; packet_1._4_4_ = packet_1._4_4_ + 1) {
      lVar6 = (long)packet_1._4_4_;
      _left = result + local_3c * width * 4;
      sVar1 = packets[lVar6 + -3].channel;
      if (sVar1 == '\0') {
        for (i = 0; i < width; i = i + 1) {
          psVar4 = stbi__readval(s,(uint)packets[lVar6 + -2].size,_left);
          if (psVar4 == (stbi_uc *)0x0) {
            return (stbi_uc *)0x0;
          }
          _left = _left + 4;
        }
      }
      else {
        iVar3 = width;
        if (sVar1 == '\x01') {
          while (stack0xffffffffffffff70 = iVar3, 0 < stack0xffffffffffffff70) {
            left_1._3_1_ = stbi__get8(s);
            iVar3 = stbi__at_eof(s);
            if (iVar3 != 0) {
              stbi__err("bad file");
              return (stbi_uc *)0x0;
            }
            if (stack0xffffffffffffff70 < (int)(uint)left_1._3_1_) {
              left_1._3_1_ = (byte)stack0xffffffffffffff70;
            }
            psVar4 = stbi__readval(s,(uint)packets[lVar6 + -2].size,(stbi_uc *)((long)&count_1 + 3))
            ;
            if (psVar4 == (stbi_uc *)0x0) {
              return (stbi_uc *)0x0;
            }
            for (_auStack_94 = 0; _auStack_94 < (int)(uint)left_1._3_1_;
                _auStack_94 = _auStack_94 + 1) {
              stbi__copyval((uint)packets[lVar6 + -2].size,_left,(stbi_uc *)((long)&count_1 + 3));
              _left = _left + 4;
            }
            iVar3 = stack0xffffffffffffff70 - (uint)left_1._3_1_;
          }
        }
        else {
          i_1 = width;
          if (sVar1 != '\x02') {
            stbi__err("bad format");
            return (stbi_uc *)0x0;
          }
          for (; 0 < i_1; i_1 = i_1 - (int)value_1) {
            value_1[0] = stbi__get8(s);
            value_1[1] = '\0';
            value_1[2] = '\0';
            value_1[3] = '\0';
            iVar3 = stbi__at_eof(s);
            if (iVar3 != 0) {
              stbi__err("bad file");
              return (stbi_uc *)0x0;
            }
            if ((int)value_1 < 0x80) {
              value_1 = (stbi_uc  [4])((int)value_1 + 1);
              if (i_1 < (int)value_1) {
                stbi__err("bad file");
                return (stbi_uc *)0x0;
              }
              for (local_a8 = 0; local_a8 < (int)value_1; local_a8 = local_a8 + 1) {
                psVar4 = stbi__readval(s,(uint)packets[lVar6 + -2].size,_left);
                if (psVar4 == (stbi_uc *)0x0) {
                  return (stbi_uc *)0x0;
                }
                _left = _left + 4;
              }
            }
            else {
              if (value_1 == (stbi_uc  [4])0x80) {
                value_1 = (stbi_uc  [4])stbi__get16be(s);
              }
              else {
                value_1 = (stbi_uc  [4])((int)value_1 + -0x7f);
              }
              if (i_1 < (int)value_1) {
                stbi__err("bad file");
                return (stbi_uc *)0x0;
              }
              psVar4 = stbi__readval(s,(uint)packets[lVar6 + -2].size,local_ac);
              if (psVar4 == (stbi_uc *)0x0) {
                return (stbi_uc *)0x0;
              }
              for (local_a8 = 0; local_a8 < (int)value_1; local_a8 = local_a8 + 1) {
                stbi__copyval((uint)packets[lVar6 + -2].size,_left,local_ac);
                _left = _left + 4;
              }
            }
          }
        }
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

static stbi_uc *stbi__pic_load_core(stbi__context *s,int width,int height,int *comp, stbi_uc *result)
{
   int act_comp=0,num_packets=0,y,chained;
   stbi__pic_packet packets[10];

   // this will (should...) cater for even some bizarre stuff like having data
    // for the same channel in multiple packets.
   do {
      stbi__pic_packet *packet;

      if (num_packets==sizeof(packets)/sizeof(packets[0]))
         return stbi__errpuc("bad format","too many packets");

      packet = &packets[num_packets++];

      chained = stbi__get8(s);
      packet->size    = stbi__get8(s);
      packet->type    = stbi__get8(s);
      packet->channel = stbi__get8(s);

      act_comp |= packet->channel;

      if (stbi__at_eof(s))          return stbi__errpuc("bad file","file too short (reading packets)");
      if (packet->size != 8)  return stbi__errpuc("bad format","packet isn't 8bpp");
   } while (chained);

   *comp = (act_comp & 0x10 ? 4 : 3); // has alpha channel?

   for(y=0; y<height; ++y) {
      int packet_idx;

      for(packet_idx=0; packet_idx < num_packets; ++packet_idx) {
         stbi__pic_packet *packet = &packets[packet_idx];
         stbi_uc *dest = result+y*width*4;

         switch (packet->type) {
            default:
               return stbi__errpuc("bad format","packet has bad compression type");

            case 0: {//uncompressed
               int x;

               for(x=0;x<width;++x, dest+=4)
                  if (!stbi__readval(s,packet->channel,dest))
                     return 0;
               break;
            }

            case 1://Pure RLE
               {
                  int left=width, i;

                  while (left>0) {
                     stbi_uc count,value[4];

                     count=stbi__get8(s);
                     if (stbi__at_eof(s))   return stbi__errpuc("bad file","file too short (pure read count)");

                     if (count > left)
                        count = (stbi_uc) left;

                     if (!stbi__readval(s,packet->channel,value))  return 0;

                     for(i=0; i<count; ++i,dest+=4)
                        stbi__copyval(packet->channel,dest,value);
                     left -= count;
                  }
               }
               break;

            case 2: {//Mixed RLE
               int left=width;
               while (left>0) {
                  int count = stbi__get8(s), i;
                  if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (mixed read count)");

                  if (count >= 128) { // Repeated
                     stbi_uc value[4];

                     if (count==128)
                        count = stbi__get16be(s);
                     else
                        count -= 127;
                     if (count > left)
                        return stbi__errpuc("bad file","scanline overrun");

                     if (!stbi__readval(s,packet->channel,value))
                        return 0;

                     for(i=0;i<count;++i, dest += 4)
                        stbi__copyval(packet->channel,dest,value);
                  } else { // Raw
                     ++count;
                     if (count>left) return stbi__errpuc("bad file","scanline overrun");

                     for(i=0;i<count;++i, dest+=4)
                        if (!stbi__readval(s,packet->channel,dest))
                           return 0;
                  }
                  left-=count;
               }
               break;
            }
         }
      }
   }

   return result;
}